

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App_inl.hpp
# Opt level: O0

App_p __thiscall CLI::App::get_subcommand_ptr(App *this,int index)

{
  size_type sVar1;
  const_reference pvVar2;
  OptionNotFound *this_00;
  uint in_EDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_register_00000034;
  long lVar3;
  App_p AVar4;
  string local_40;
  uint local_20;
  uint local_1c;
  uint uindex;
  int index_local;
  App *this_local;
  
  lVar3 = CONCAT44(in_register_00000034,index);
  local_1c = in_EDX;
  _uindex = lVar3;
  this_local = this;
  if ((-1 < (int)in_EDX) &&
     (local_20 = in_EDX,
     sVar1 = std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::
             size((vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_> *)
                  (lVar3 + 0x2c0)), in_EDX < sVar1)) {
    pvVar2 = std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::
             operator[]((vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                         *)(lVar3 + 0x2c0),(ulong)local_20);
    std::shared_ptr<CLI::App>::shared_ptr((shared_ptr<CLI::App> *)this,pvVar2);
    AVar4.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    AVar4.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
    return (App_p)AVar4.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (OptionNotFound *)__cxa_allocate_exception(0x38);
  std::__cxx11::to_string(&local_40,local_1c);
  OptionNotFound::OptionNotFound(this_00,&local_40);
  __cxa_throw(this_00,&OptionNotFound::typeinfo,OptionNotFound::~OptionNotFound);
}

Assistant:

CLI11_NODISCARD CLI11_INLINE CLI::App_p App::get_subcommand_ptr(int index) const {
    if(index >= 0) {
        auto uindex = static_cast<unsigned>(index);
        if(uindex < subcommands_.size())
            return subcommands_[uindex];
    }
    throw OptionNotFound(std::to_string(index));
}